

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lup_matrix.cpp
# Opt level: O1

string * __thiscall LUPMatrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,LUPMatrix *this)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream out;
  Permutation local_1c8;
  Matrix local_1b0;
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  bVar1 = Permutation::IsIdentity(&this->row_permutation_);
  if (!bVar1) {
    Permutation::GetInverse(&local_1c8,&this->row_permutation_);
    Permutation::AsMatrix(&local_1b0,&local_1c8);
    poVar2 = operator<<((ostream *)local_190,&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," \\ \\cdot\\",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::~vector(&local_1b0.elements_);
    if (local_1c8.permutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.permutation_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1c8.permutation_.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.permutation_.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  poVar2 = operator<<((ostream *)local_190,&this->l_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," \\ \\cdot\\",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  operator<<((ostream *)local_190,&this->u_);
  bVar1 = Permutation::IsIdentity(&this->column_permutation_);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\\ \\cdot\\",8);
    std::ios::widen((char)(ostream *)local_190 + (char)*(undefined8 *)(local_190[0] + -0x18));
    std::ostream::put((char)local_190);
    std::ostream::flush();
    Permutation::AsMatrix(&local_1b0,&this->column_permutation_);
    operator<<((ostream *)local_190,&local_1b0);
    std::
    vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
    ::~vector(&local_1b0.elements_);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string LUPMatrix::ToLaTex() const {
  std::ostringstream out;
  if (!row_permutation_.IsIdentity()) {
      out << row_permutation_.GetInverse().AsMatrix() << R"( \ \cdot\)" << std::endl;
  }
  out << l_ << R"( \ \cdot\)" << std::endl;
  out << u_;
  if (!column_permutation_.IsIdentity()) {
      out << R"(\ \cdot\)" << std::endl;
      out << column_permutation_.AsMatrix();
  }

  return out.str();
}